

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

size_t __thiscall roaring::Roaring64Map::getSizeInBytes(Roaring64Map *this,bool portable)

{
  unsigned_long uVar1;
  
  uVar1 = std::
          accumulate<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,unsigned_long,roaring::Roaring64Map::getSizeInBytes(bool)const::_lambda(unsigned_long,std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
                    ((this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>)
                     &(this->roarings)._M_t._M_impl.super__Rb_tree_header,
                     (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count * 4 + 8,
                     (anon_class_1_1_135c2ad9)portable);
  return uVar1;
}

Assistant:

size_t getSizeInBytes(bool portable = true) const {
        // start with, respectively, map size and size of keys for each map
        // entry
        return std::accumulate(
            roarings.cbegin(), roarings.cend(),
            sizeof(uint64_t) + roarings.size() * sizeof(uint32_t),
            [=](size_t previous,
                const std::pair<const uint32_t, Roaring> &map_entry) {
                // add in bytes used by each Roaring
                return previous + map_entry.second.getSizeInBytes(portable);
            });
    }